

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O2

SQNativeClosure * __thiscall SQNativeClosure::Clone(SQNativeClosure *this)

{
  SQUnsignedInteger *pSVar1;
  SQWeakRef *pSVar2;
  SQNativeClosure *pSVar3;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  SQInteger _n_;
  long lVar4;
  long lVar5;
  
  pSVar3 = Create((this->super_SQCollectable)._sharedstate,this->_function,this->_noutervalues);
  pSVar2 = this->_env;
  pSVar3->_env = pSVar2;
  if (pSVar2 != (SQWeakRef *)0x0) {
    pSVar1 = &(pSVar2->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::operator=(&pSVar3->_name,&this->_name);
  lVar5 = 0;
  src = extraout_RDX;
  for (lVar4 = 0; lVar4 < (long)this->_noutervalues; lVar4 = lVar4 + 1) {
    SQObjectPtr::operator=
              ((SQObjectPtr *)((long)&(pSVar3->_outervalues->super_SQObject)._type + lVar5),
               (SQObjectPtr *)((long)&(this->_outervalues->super_SQObject)._type + lVar5));
    lVar5 = lVar5 + 0x10;
    src = extraout_RDX_00;
  }
  sqvector<long_long>::copy(&pSVar3->_typecheck,(EVP_PKEY_CTX *)&this->_typecheck,src);
  pSVar3->_nparamscheck = this->_nparamscheck;
  return pSVar3;
}

Assistant:

SQNativeClosure *Clone()
    {
        SQNativeClosure * ret = SQNativeClosure::Create(_opt_ss(this),_function,_noutervalues);
        ret->_env = _env;
        if(ret->_env) __ObjAddRef(ret->_env);
        ret->_name = _name;
        _COPY_VECTOR(ret->_outervalues,_outervalues,_noutervalues);
        ret->_typecheck.copy(_typecheck);
        ret->_nparamscheck = _nparamscheck;
        return ret;
    }